

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

Symbol * slang::ast::anon_unknown_39::unwrapTypeParam(Scope *scope,Symbol *symbol)

{
  bool bVar1;
  Type *this;
  
  if (symbol->kind == TypeParameter) {
    Compilation::noteReference(scope->compilation,symbol,false);
    this = DeclaredType::getType((DeclaredType *)&symbol[1].location);
    bVar1 = Type::isError(this);
    symbol = &((Type *)0x0)->super_Symbol;
    if (!bVar1) {
      symbol = &this->super_Symbol;
    }
  }
  return &((Type *)symbol)->super_Symbol;
}

Assistant:

const Symbol* unwrapTypeParam(const Scope& scope, const Symbol* symbol) {
    if (symbol->kind == SymbolKind::TypeParameter) {
        scope.getCompilation().noteReference(*symbol);

        auto result = &symbol->as<TypeParameterSymbol>().targetType.getType();
        if (result->isError())
            return nullptr;

        return result;
    }
    return symbol;
}